

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFont * __thiscall ImFontAtlas::AddFont(ImFontAtlas *this,ImFontConfig *font_cfg)

{
  value_type *pvVar1;
  value_type *ppIVar2;
  void *__dest;
  ImFont *font;
  
  if ((font_cfg->FontData != (void *)0x0) && (0 < font_cfg->FontDataSize)) {
    if (0.0 < font_cfg->SizePixels) {
      if (font_cfg->MergeMode == false) {
        font = (ImFont *)ImGui::MemAlloc(0x68);
        ImFont::ImFont(font);
        ImVector<ImFont_*>::push_back(&this->Fonts,&font);
      }
      ImVector<ImFontConfig>::push_back(&this->ConfigData,font_cfg);
      pvVar1 = ImVector<ImFontConfig>::back(&this->ConfigData);
      if (pvVar1->DstFont == (ImFont *)0x0) {
        ppIVar2 = ImVector<ImFont_*>::back(&this->Fonts);
        pvVar1->DstFont = *ppIVar2;
      }
      if (pvVar1->FontDataOwnedByAtlas == false) {
        __dest = ImGui::MemAlloc((long)pvVar1->FontDataSize);
        pvVar1->FontData = __dest;
        pvVar1->FontDataOwnedByAtlas = true;
        memcpy(__dest,font_cfg->FontData,(long)pvVar1->FontDataSize);
      }
      ClearTexData(this);
      return pvVar1->DstFont;
    }
    __assert_fail("font_cfg->SizePixels > 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                  ,0x46e,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
  }
  __assert_fail("font_cfg->FontData != __null && font_cfg->FontDataSize > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                ,0x46d,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
}

Assistant:

ImFont* ImFontAtlas::AddFont(const ImFontConfig* font_cfg)
{
    IM_ASSERT(font_cfg->FontData != NULL && font_cfg->FontDataSize > 0);
    IM_ASSERT(font_cfg->SizePixels > 0.0f);

    // Create new font
    if (!font_cfg->MergeMode)
    {
        ImFont* font = (ImFont*)ImGui::MemAlloc(sizeof(ImFont));
        IM_PLACEMENT_NEW(font) ImFont();
        Fonts.push_back(font);
    }

    ConfigData.push_back(*font_cfg);
    ImFontConfig& new_font_cfg = ConfigData.back();
	if (!new_font_cfg.DstFont)
	    new_font_cfg.DstFont = Fonts.back();
    if (!new_font_cfg.FontDataOwnedByAtlas)
    {
        new_font_cfg.FontData = ImGui::MemAlloc(new_font_cfg.FontDataSize);
        new_font_cfg.FontDataOwnedByAtlas = true;
        memcpy(new_font_cfg.FontData, font_cfg->FontData, (size_t)new_font_cfg.FontDataSize);
    }

    // Invalidate texture
    ClearTexData();
    return new_font_cfg.DstFont;
}